

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

int svd(double *A,int M,int N,double *U,double *V,double *q)

{
  size_t __size;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  void *__ptr;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  double *pdVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  double *pdVar29;
  double *pdVar30;
  bool bVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double *local_130;
  double *local_78;
  double *local_60;
  
  if (M < N) {
    puts("Rows (M) should be greater than Columns (B) ");
    printf("Retry By Transposing the Input Matrix");
    return -1;
  }
  lVar25 = (long)N;
  __size = lVar25 * 8;
  __ptr = malloc(__size);
  dVar32 = macheps();
  uVar14 = 0;
  uVar6 = (ulong)(uint)(N * M);
  if (N * M < 1) {
    uVar6 = uVar14;
  }
  for (; uVar6 != uVar14; uVar14 = uVar14 + 1) {
    U[uVar14] = A[uVar14];
  }
  uVar12 = N - 1;
  lVar27 = (long)M;
  uVar14 = (ulong)(int)uVar12;
  uVar6 = 0;
  if (0 < N) {
    uVar6 = (ulong)(uint)N;
  }
  local_60 = (double *)(ulong)(uint)M;
  lVar9 = lVar25 * 8 + 8;
  iVar2 = 1;
  dVar39 = 0.0;
  dVar38 = 0.0;
  dVar37 = 0.0;
  uVar18 = (ulong)uVar12;
  pdVar11 = U;
  uVar23 = 0;
  local_78 = U;
  while( true ) {
    uVar21 = uVar23 & 0xffffffff;
    if ((int)uVar23 < M) {
      uVar21 = (ulong)(uint)M;
    }
    if (uVar23 == uVar6) break;
    lVar28 = (long)iVar2;
    pdVar29 = (double *)(lVar9 * lVar28 + (long)U);
    pdVar30 = local_78 + lVar28;
    dVar40 = dVar39 * dVar37;
    *(double *)((long)__ptr + uVar23 * 8) = dVar40;
    dVar37 = 0.0;
    pdVar10 = pdVar11;
    pdVar15 = local_60;
    while (bVar31 = pdVar15 != (double *)0x0, pdVar15 = (double *)((long)pdVar15 - 1), bVar31) {
      dVar37 = dVar37 + ABS(*pdVar10);
      pdVar10 = pdVar10 + lVar25;
    }
    dVar33 = 0.0;
    if ((dVar37 != 0.0) || (NAN(dVar37))) {
      dVar39 = 0.0;
      pdVar10 = pdVar11;
      pdVar15 = local_60;
      while (bVar31 = pdVar15 != (double *)0x0, pdVar15 = (double *)((long)pdVar15 - 1), bVar31) {
        dVar33 = *pdVar10 / dVar37;
        *pdVar10 = dVar33;
        dVar39 = dVar39 + dVar33 * dVar33;
        pdVar10 = pdVar10 + lVar25;
      }
      iVar1 = (N + 1) * (int)uVar23;
      dVar35 = U[iVar1];
      if (dVar39 < 0.0) {
        dVar33 = sqrt(dVar39);
      }
      else {
        dVar33 = SQRT(dVar39);
      }
      dVar33 = (double)(~-(ulong)(dVar35 < 0.0) & (ulong)-dVar33 |
                       -(ulong)(dVar35 < 0.0) & (ulong)dVar33);
      U[iVar1] = dVar35 - dVar33;
      pdVar10 = pdVar11;
      if ((long)uVar23 < (long)uVar14) {
        for (lVar7 = lVar28; lVar7 < lVar25; lVar7 = lVar7 + 1) {
          dVar34 = 0.0;
          lVar16 = 0;
          for (uVar18 = uVar21; uVar23 != uVar18; uVar18 = uVar18 - 1) {
            dVar34 = dVar34 + *(double *)((long)pdVar11 + lVar16) *
                              *(double *)((long)pdVar30 + lVar16);
            lVar16 = lVar16 + __size;
          }
          lVar16 = 0;
          for (uVar18 = uVar21; uVar23 != uVar18; uVar18 = uVar18 - 1) {
            *(double *)((long)pdVar30 + lVar16) =
                 *(double *)((long)pdVar11 + lVar16) * (dVar34 / (dVar35 * dVar33 - dVar39)) +
                 *(double *)((long)pdVar30 + lVar16);
            lVar16 = lVar16 + __size;
          }
          pdVar30 = pdVar30 + 1;
        }
      }
      for (; uVar23 != uVar21; uVar21 = uVar21 - 1) {
        *pdVar10 = *pdVar10 * dVar37;
        pdVar10 = pdVar10 + lVar25;
      }
    }
    dVar39 = 0.0;
    uVar18 = uVar23 + 1;
    dVar33 = dVar33 * dVar37;
    q[uVar23] = dVar33;
    if (uVar23 == uVar12) {
      dVar37 = 0.0;
    }
    else {
      dVar37 = 0.0;
      for (lVar7 = lVar28; lVar7 < lVar27; lVar7 = lVar7 + 1) {
        dVar37 = dVar37 + ABS(local_78[lVar7]);
      }
      dVar39 = 0.0;
      if ((dVar37 != 0.0) || (NAN(dVar37))) {
        dVar40 = 0.0;
        for (lVar7 = lVar28; lVar7 < lVar25; lVar7 = lVar7 + 1) {
          dVar39 = local_78[lVar7] / dVar37;
          local_78[lVar7] = dVar39;
          dVar40 = dVar40 + dVar39 * dVar39;
        }
        dVar33 = U[uVar23 * lVar25 + uVar18];
        if (dVar40 < 0.0) {
          dVar39 = sqrt(dVar40);
        }
        else {
          dVar39 = SQRT(dVar40);
        }
        dVar39 = (double)(~-(ulong)(dVar33 < 0.0) & (ulong)-dVar39 |
                         -(ulong)(dVar33 < 0.0) & (ulong)dVar39);
        U[uVar23 * lVar25 + uVar18] = dVar33 - dVar39;
        for (lVar7 = lVar28; lVar16 = lVar28, lVar7 < lVar25; lVar7 = lVar7 + 1) {
          *(double *)((long)__ptr + lVar7 * 8) = local_78[lVar7] / (dVar33 * dVar39 - dVar40);
        }
        for (; lVar16 < lVar27; lVar16 = lVar16 + 1) {
          dVar40 = 0.0;
          pdVar30 = pdVar29;
          for (lVar7 = lVar28; lVar7 < lVar25; lVar7 = lVar7 + 1) {
            dVar40 = dVar40 + *pdVar30 * local_78[lVar7];
            pdVar30 = pdVar30 + 1;
          }
          for (lVar7 = 0; lVar28 + lVar7 < lVar25; lVar7 = lVar7 + 1) {
            pdVar29[lVar7] =
                 *(double *)((long)__ptr + lVar7 * 8 + lVar28 * 8) * dVar40 + pdVar29[lVar7];
          }
          pdVar29 = pdVar29 + lVar25;
        }
        for (; lVar28 < lVar25; lVar28 = lVar28 + 1) {
          local_78[lVar28] = local_78[lVar28] * dVar37;
        }
        dVar33 = q[uVar23];
        dVar40 = *(double *)((long)__ptr + uVar23 * 8);
      }
    }
    dVar35 = ABS(dVar40) + ABS(dVar33);
    if (ABS(dVar40) + ABS(dVar33) <= dVar38) {
      dVar35 = dVar38;
    }
    dVar38 = dVar35;
    iVar2 = iVar2 + 1;
    local_60 = (double *)((long)local_60 - 1);
    pdVar11 = pdVar11 + lVar25 + 1;
    local_78 = local_78 + lVar25;
    uVar23 = uVar18;
  }
  lVar28 = lVar25 * uVar14;
  pdVar11 = U + lVar28;
  pdVar30 = V + uVar14;
  pdVar10 = V + lVar28;
  for (uVar23 = uVar14; -1 < (long)uVar23; uVar23 = uVar23 - 1) {
    uVar21 = uVar23 & 0xffffffff;
    if ((long)uVar23 < (long)uVar14) {
      if ((dVar39 != 0.0) || (NAN(dVar39))) {
        dVar37 = U[uVar23 + (long)((int)uVar23 * N) + 1];
        lVar16 = (long)(int)uVar18;
        pdVar15 = (double *)((long)pdVar30 + __size * lVar16);
        for (lVar7 = lVar16; lVar7 < lVar25; lVar7 = lVar7 + 1) {
          *pdVar15 = pdVar11[lVar7] / (dVar39 * dVar37);
          pdVar15 = pdVar15 + lVar25;
        }
        pdVar15 = (double *)(lVar9 * lVar16 + (long)V);
        for (lVar7 = lVar16; lVar7 < lVar25; lVar7 = lVar7 + 1) {
          dVar39 = 0.0;
          pdVar29 = pdVar15;
          for (lVar24 = lVar16; lVar24 < lVar25; lVar24 = lVar24 + 1) {
            dVar39 = dVar39 + pdVar11[lVar24] * *pdVar29;
            pdVar29 = pdVar29 + lVar25;
          }
          lVar8 = 0;
          for (lVar24 = lVar16; lVar24 < lVar25; lVar24 = lVar24 + 1) {
            *(double *)((long)pdVar15 + lVar8) =
                 *(double *)((long)pdVar30 + lVar8 + __size * lVar16) * dVar39 +
                 *(double *)((long)pdVar15 + lVar8);
            lVar8 = lVar8 + __size;
          }
          pdVar15 = pdVar15 + 1;
        }
      }
      lVar7 = (long)(int)uVar18;
      pdVar15 = (double *)(__size * lVar7 + (long)pdVar30);
      for (; lVar7 < lVar25; lVar7 = lVar7 + 1) {
        *pdVar15 = 0.0;
        pdVar10[lVar7] = 0.0;
        pdVar15 = pdVar15 + lVar25;
      }
    }
    V[uVar23 * lVar25 + uVar23] = 1.0;
    dVar39 = *(double *)((long)__ptr + uVar23 * 8);
    pdVar11 = pdVar11 + -lVar25;
    pdVar30 = pdVar30 + -1;
    pdVar10 = pdVar10 + -lVar25;
    uVar18 = uVar21;
  }
  pdVar11 = U + lVar28;
  pdVar30 = (double *)(lVar9 * uVar14 + (long)U);
  uVar19 = (N + 1) * N;
  uVar3 = ~N;
  uVar12 = uVar19 - 1;
  uVar4 = N * N;
  uVar5 = uVar4 - 1;
  iVar2 = N;
  for (uVar18 = uVar14; -1 < (long)uVar18; uVar18 = uVar18 - 1) {
    dVar39 = q[uVar18];
    if ((long)uVar18 < (long)uVar14) {
      for (lVar9 = (long)iVar2; lVar9 < lVar25; lVar9 = lVar9 + 1) {
        pdVar11[lVar9] = 0.0;
      }
    }
    if ((dVar39 != 0.0) || (pdVar10 = pdVar30, uVar23 = uVar18, NAN(dVar39))) {
      pdVar10 = pdVar30;
      uVar23 = uVar18;
      if (uVar18 != uVar14) {
        uVar21 = uVar18 & 0xffffffff;
        uVar13 = uVar19;
        uVar26 = uVar4;
        while (uVar22 = (int)uVar21 + 1, uVar21 = (ulong)uVar22, (int)uVar22 < N) {
          dVar37 = 0.0;
          uVar20 = uVar12;
          uVar22 = uVar13;
          for (iVar1 = iVar2; iVar1 < M; iVar1 = iVar1 + 1) {
            dVar37 = dVar37 + U[uVar20] * U[uVar22];
            uVar22 = uVar22 + N;
            uVar20 = uVar20 + N;
          }
          dVar40 = U[uVar18 + (long)((int)uVar18 * N)];
          uVar17 = uVar18 & 0xffffffff;
          uVar20 = uVar5;
          uVar22 = uVar26;
          while( true ) {
            if (M <= (int)uVar17) break;
            U[uVar22] = U[uVar20] * ((dVar37 / dVar40) / dVar39) + U[uVar22];
            uVar22 = uVar22 + N;
            uVar20 = uVar20 + N;
            uVar17 = (ulong)((int)uVar17 + 1);
          }
          uVar13 = uVar13 + 1;
          uVar26 = uVar26 + 1;
        }
      }
      for (; (long)uVar23 < lVar27; uVar23 = uVar23 + 1) {
        *pdVar10 = *pdVar10 / dVar39;
        pdVar10 = pdVar10 + lVar25;
      }
    }
    else {
      for (; (long)uVar23 < lVar27; uVar23 = uVar23 + 1) {
        *pdVar10 = 0.0;
        pdVar10 = pdVar10 + lVar25;
      }
    }
    U[uVar18 * lVar25 + uVar18] = U[uVar18 * lVar25 + uVar18] + 1.0;
    iVar2 = iVar2 + -1;
    pdVar11 = pdVar11 + -lVar25;
    pdVar30 = (double *)((long)pdVar30 + (__size ^ 0xfffffffffffffff8));
    uVar19 = uVar19 + uVar3;
    uVar12 = uVar12 + uVar3;
    uVar4 = uVar4 + uVar3;
    uVar5 = uVar5 + uVar3;
  }
  uVar12 = 0;
  if (0 < M) {
    uVar12 = M;
  }
  dVar32 = dVar32 * dVar38;
  local_130 = V + uVar14;
LAB_0012013c:
  if ((long)uVar14 < 0) {
    svd_sort(U,M,N,V,q);
    free(__ptr);
    return 0;
  }
  uVar18 = uVar14 - 1;
  iVar2 = 0;
  do {
    if (iVar2 == 0x32) {
      puts("Convergence Not Achieved ");
      return 0xf;
    }
    iVar2 = iVar2 + 1;
    uVar21 = (long)(int)uVar14;
    for (uVar23 = uVar14; uVar5 = (uint)uVar23, -1 < (int)uVar5; uVar23 = uVar23 - 1) {
      if (ABS(*(double *)((long)__ptr + (uVar23 & 0xffffffff) * 8)) <= dVar32) goto LAB_001202c8;
      if (ABS(q[(uVar23 & 0xffffffff) - 1]) <= dVar32) goto LAB_001201b6;
      uVar21 = uVar21 - 1;
    }
    uVar5 = 0xffffffff;
LAB_001201b6:
    if ((long)uVar23 < 0) {
      uVar23 = 0xffffffffffffffff;
    }
    lVar27 = uVar23 * 8;
    if ((long)uVar21 < 0) {
      uVar21 = 0xffffffffffffffff;
    }
    dVar39 = 0.0;
    dVar38 = 1.0;
    for (; (long)uVar23 <= (long)uVar14; uVar23 = uVar23 + 1) {
      dVar37 = *(double *)((long)__ptr + uVar23 * 8);
      dVar38 = dVar38 * dVar37;
      *(double *)((long)__ptr + uVar23 * 8) = dVar39 * dVar37;
      if (ABS(dVar38) <= dVar32) break;
      dVar39 = q[uVar23];
      dVar37 = hypot(dVar38,dVar39);
      q[uVar23] = dVar37;
      dVar39 = dVar39 / dVar37;
      dVar38 = -dVar38 / dVar37;
      pdVar11 = U;
      uVar17 = (ulong)uVar12;
      while (bVar31 = uVar17 != 0, uVar17 = uVar17 - 1, bVar31) {
        dVar37 = pdVar11[uVar21 - 1];
        dVar40 = *(double *)((long)pdVar11 + lVar27);
        pdVar11[uVar21 - 1] = dVar37 * dVar39 + dVar38 * dVar40;
        *(double *)((long)pdVar11 + lVar27) = dVar40 * dVar39 - dVar38 * dVar37;
        pdVar11 = pdVar11 + lVar25;
      }
      lVar27 = lVar27 + 8;
    }
    uVar23 = (ulong)uVar5;
LAB_001202c8:
    dVar39 = q[uVar14];
    if ((int)uVar23 == (int)uVar14) break;
    lVar9 = (long)(int)uVar23;
    dVar38 = q[lVar9];
    dVar37 = q[uVar18];
    dVar40 = *(double *)((long)__ptr + uVar18 * 8);
    dVar33 = *(double *)((long)__ptr + uVar14 * 8);
    dVar40 = ((dVar37 / dVar33 + ((dVar40 - dVar39) / dVar37) * ((dVar39 + dVar40) / dVar33)) -
             dVar33 / dVar37) * 0.5;
    dVar35 = hypot(dVar40,1.0);
    dVar40 = (dVar33 / dVar38) *
             (dVar37 / ((double)((ulong)-dVar35 & -(ulong)(dVar40 < 0.0) |
                                ~-(ulong)(dVar40 < 0.0) & (ulong)dVar35) + dVar40) - dVar33) +
             (dVar38 - (dVar39 / dVar38) * dVar39);
    local_60 = V + lVar9 + 1;
    lVar28 = lVar9 << 0x20;
    pdVar11 = U + lVar9 + 1;
    dVar37 = 1.0;
    dVar39 = 1.0;
    lVar27 = lVar9;
    while (lVar27 < (long)uVar14) {
      lVar7 = lVar27 + 1;
      dVar33 = *(double *)((long)__ptr + lVar7 * 8);
      dVar35 = q[lVar7];
      dVar39 = dVar39 * dVar33;
      dVar33 = dVar37 * dVar33;
      dVar34 = hypot(dVar40,dVar39);
      *(double *)((long)__ptr + lVar27 * 8) = dVar34;
      dVar40 = dVar40 / dVar34;
      dVar34 = dVar39 / dVar34;
      dVar39 = dVar35 * dVar34;
      lVar16 = lVar28;
      pdVar30 = local_60;
      uVar23 = uVar6;
      while (bVar31 = uVar23 != 0, uVar23 = uVar23 - 1, bVar31) {
        dVar37 = *(double *)((long)V + (lVar16 >> 0x1d));
        dVar36 = *pdVar30;
        *(double *)((long)V + (lVar16 >> 0x1d)) = dVar37 * dVar40 + dVar34 * dVar36;
        *pdVar30 = dVar36 * dVar40 - dVar34 * dVar37;
        pdVar30 = pdVar30 + lVar25;
        lVar16 = lVar16 + (lVar25 << 0x20);
      }
      dVar37 = dVar38 * dVar40 + dVar33 * dVar34;
      dVar36 = hypot(dVar37,dVar39);
      q[lVar27] = dVar36;
      dVar39 = dVar39 / dVar36;
      if ((dVar36 == 0.0) && (!NAN(dVar36))) {
        dVar39 = dVar34;
      }
      dVar37 = dVar37 / dVar36;
      if ((dVar36 == 0.0) && (!NAN(dVar36))) {
        dVar37 = dVar40;
      }
      dVar38 = dVar33 * dVar40 + -dVar38 * dVar34;
      dVar35 = dVar35 * dVar40;
      lVar27 = lVar28;
      pdVar30 = pdVar11;
      uVar23 = (ulong)uVar12;
      while (bVar31 = uVar23 != 0, uVar23 = uVar23 - 1, bVar31) {
        dVar40 = *(double *)((long)U + (lVar27 >> 0x1d));
        dVar33 = *pdVar30;
        *(double *)((long)U + (lVar27 >> 0x1d)) = dVar40 * dVar37 + dVar39 * dVar33;
        *pdVar30 = dVar33 * dVar37 - dVar39 * dVar40;
        pdVar30 = pdVar30 + lVar25;
        lVar27 = lVar27 + (lVar25 << 0x20);
      }
      dVar40 = dVar38 * dVar37 + dVar35 * dVar39;
      dVar38 = dVar35 * dVar37 + -dVar39 * dVar38;
      local_60 = local_60 + 1;
      lVar28 = lVar28 + 0x100000000;
      pdVar11 = pdVar11 + 1;
      lVar27 = lVar7;
    }
    *(undefined8 *)((long)__ptr + lVar9 * 8) = 0;
    *(double *)((long)__ptr + uVar14 * 8) = dVar40;
    q[uVar14] = dVar38;
  } while( true );
  if (dVar39 < 0.0) {
    q[uVar14] = -dVar39;
    pdVar11 = local_130;
    uVar14 = uVar6;
    while (bVar31 = uVar14 != 0, uVar14 = uVar14 - 1, bVar31) {
      *pdVar11 = -*pdVar11;
      pdVar11 = pdVar11 + lVar25;
    }
  }
  local_130 = local_130 + -1;
  uVar14 = uVar18;
  goto LAB_0012013c;
}

Assistant:

int svd(double *A,int M,int N,double *U,double *V,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1;
	double eps,g,x,s,temp,f,h,c,y,z,scale;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE SVD,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * U = MXN
	 * V - NXN
	 * Q - NX1
	 */

	/*
	 * The program return error codes
	 *
	 *  Code 0 if the computation is successful
	 *  Code -1 If  M < N . Transpose the matrix such that rows > columns and try again
	 *  Code 15 if maximum iterations are reached without achieving convergence. Increase SVDMAXITER value
	 *  in matrix.h header file. Default Value is 50
	 *
	 */
	if (M < N) {
		printf("Rows (M) should be greater than Columns (B) \n");
		printf("Retry By Transposing the Input Matrix");
		return -1;
	}
	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	g = scale = x = 0.0;

	for(i = 0; i < M*N;++i) {
		U[i] = A[i];
	}

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = scale * g;
		g = 0.0;
		s = 0.0;
		scale = 0.0;

		if (i < M) {
			for(k = i; k < M;++k) {
				scale += fabs(U[k*N+i]);
			}

			if (scale != 0.0) {
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+i] /= scale;
					temp = U[t+i];
					s += temp*temp;
				}
				f = U[i*N+i];
				g = (f < 0) ? sqrt(s) : -sqrt(s);
				h = f * g - s;
				U[i*N+i] = f - g;

				if (i < N - 1) {
					for(j = l; j < N;++j) {
						s = 0.0;
						for(k = i; k < M;++k) {
							t = k * N;
							s += U[t+i]*U[t+j];
						}
						f = s / h;
						for(k = i; k < M;++k) {
							t = k * N;
							U[t+j] += f * U[t+i];
						}
					}
				}
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+i] *= scale;
				}
			}
		}
        q[i] = scale * g;
        g = 0.0;
        s = 0.0;
        scale = 0.0;

        if (i < M && i != N - 1) {
        	t = i *N;
        	for(k = l; k < M;++k) {
        		scale += fabs(U[t+k]);
        	}
        	if (scale != 0.0) {
        		for(k = l; k < N;++k) {
        			U[t+k] /= scale;
        			temp = U[t+k];
        			s = s + temp*temp;
        		}
        		f = U[t+l];
        		g = (f < 0) ? sqrt(s) : -sqrt(s);
                h = f * g - s;
                U[t+l] = f - g;
                for(k = l;k < N;++k) {
                	e[k] = U[t+k] / h;
                }

				for (j = l; j < M; j++) {
					s = 0.0;
					t2 = j * N;
					for (k = l; k < N; k++) {
						s += U[t2+k] * U[t+k];
					}
					for (k = l; k < N; k++) {
						U[t2+k] += s * e[k];
					}
				}
                for (k = l; k < N; k++)
                    U[t+k] *= scale;
        	}

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}

	/*
	ierr = 0;
	eps = macheps();
	tol = eps;
	g = x = 0.0;

	for(i = 0; i < M*N;++i) {
		U[i] = A[i];
	}

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = g;
		s = 0.0;

		for(k = i; k < M;++k) {
			t = k * N;
			temp = U[t+i];
			s += temp*temp;
		}
		if (s < tol) {
			g = 0.0;
		} else {
			f = U[i*N+i];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
			U[i*N+i] = f - g;

			for(j = l; j < N;++j) {
				s = 0.0;
				for(k = i; k < M;++k) {
					t = k * N;
					s += (U[t+i]*U[t+j]);
				}
				f = s / h;
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+j] += (f * U[t+i]);
				}
			}

		}

        q[i] = g;
        s = 0.0;
        t = i * N;
    	for(k = l; k < N;++k) {
    		temp = U[t+k];
    		s = s + temp*temp;
    	}
        if (s < tol) {
        	g = 0.0;
        } else {
        	f = U[t+l];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
            U[t+l] = f - g;
            for(k = l;k < N;++k) {
              	e[k] = U[t+k] / h;
            }

            for (j = l; j < M; j++) {
                s = 0.0;
                t2 = j * N;
                for (k = l; k < N; k++) {
                     s += U[t2+k] * U[t+k];
                }
                for (k = l; k < N; k++) {
                     U[t2+k] += s * e[k];
                }
            }

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}
*/


//Accumulating Right Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * N;
		if (i < N - 1) {
			if (g != 0.0) {
				h = U[t+i+1] * g;
				for(j = l;j < N;++j) {
					V[j*N+i] = U[t+j] / h;
				}
				for(j = l;j < N;++j) {
					s = 0.0;
					for(k = l; k < N;++k) {
						s += U[t+k] * V[k*N+j];
					}
					for(k = l; k < N;++k) {
						V[k*N+j] += (s * V[k*N+i]);
					}
				}
			}
			for(j = l; j < N;++j) {
				V[t+j] = V[j*N+i] = 0.0;
			}
		}
	    V[t+i] = 1.0;
		g = e[i];
		l = i;
	}



//Accumulating Left Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * N;
		l = i+1;
		g = q[i];

		if (i < N - 1) {
			for(j = l;j < N;++j) {
				U[t+j] = 0.0;
			}
		}

		if (g != 0.0) {
			if (i != N - 1) {
				//h = U[t+i] * g;
				for(j = l;j < N;++j) {
					s = 0.0;
					for(k = l; k < M;++k) {
						s += (U[k*N+i] * U[k*N+j]);
					}
					f = (s / U[t+i]) / g;
					for(k = i; k < M;++k) {
						U[k*N+j] += (f * U[k*N+i]);
					}
				}
			}
			for(j = i; j < M;++j) {
				U[j*N+i] = U[j*N+i] / g;
			}
		} else {
			for(j = i; j < M;++j) {
				U[j*N+i] = 0.0;
			}
		}

		U[t+i] += 1.0;
	}
//	mdisplay(U,M,N);

	eps = eps * x;

	for(k = N - 1; k >= 0; --k) {
		iter = 0;

		while(1) {
			iter++;
			if (iter > SVDMAXITER) {
				printf("Convergence Not Achieved \n");
				return 15;
			}

			cancel = 1;
			for(l = k; l >= 0; --l) {
				if (fabs(e[l]) <= eps) {
					cancel = 0; //test f convergence
					break;
				}
				if (fabs(q[l-1]) <= eps) {
					//Cancel
					break;
				}
			}
			if (cancel) {
				c = 0.0;
				s = 1.0;
				l1 = l - 1;
				for(i = l; i <= k;++i) {
					f = s*e[i];
					e[i] *= c;
					if (fabs(f) <= eps) {
						break;
					}
					g = q[i];
					h = q[i] = hypot(f,g);
					c = g/h;
					s = -f/h;
					for(j = 0; j < M;++j) {
						t = j * N;
						y = U[t+l1];
						z = U[t+i];

						U[t+l1] = y * c + z * s;
						U[t+i] = z * c - y * s;
					}
				}
			}
			z = q[k];
			if (l != k) {
				x = q[l];
				y = q[k-1];
				g = e[k-1];
				h = e[k];
				f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
				g = hypot(f,1.0);
				if (f < 0.0) {
					temp = f - g;
				} else {
					temp = f+g;
				}
				f = x - (z / x) * z + (h / x) * (y / temp - h);

				//Next QR Transformation

				c = s = 1.0;
				for(i = l+1; i <= k;++i) {
					g = e[i];
					y = q[i];
					h = s * g;
					g = c * g;
					e[i-1] = z = hypot(f,h);
                    c = f / z;
                    s = h / z;
                    f = x * c + g * s;
                    g = g * c - x * s;
                    h = y * s;
                    y *= c;
                    for(j = 0; j < N;++j) {
                    	t = j * N;
                        x = V[t+i-1];
                        z = V[t+i];
                        V[t+i-1] = x * c + z * s;
                        V[t+i] = z * c - x * s;
                    }
                    q[i-1] = z = hypot(f,h);
                    if (z != 0.0) {
                        c = f / z;
                        s = h / z;
                    }
                    f = c * g + s * y;
                    x = c * y - s * g;
                    for(j = 0; j < M;++j) {
                    	t = j * N;
                        y = U[t+i-1];
                        z = U[t+i];
                        U[t+i-1] = y * c + z * s;
                        U[t+i] = z * c - y * s;
                    }
				}
                    e[l] = 0.0;
                    e[k] = f;
                    q[k] = x;

			} else {
				//convergence
                if (z < 0.0) {
                    q[k] = -z;
                    for (j = 0; j < N; j++) {
                    	t = j *N;
                        V[t+k] = -V[t+k];
                    }
                }
                break;
			}
		}
	}

	svd_sort(U,M,N,V,q);

	free(e);
	return ierr;
}